

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

int mbedtls_entropy_self_test(int verbose)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  char *__s;
  uchar buf [64];
  uchar acc [64];
  mbedtls_entropy_context ctx;
  
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  acc[0x30] = '\0';
  acc[0x31] = '\0';
  acc[0x32] = '\0';
  acc[0x33] = '\0';
  acc[0x34] = '\0';
  acc[0x35] = '\0';
  acc[0x36] = '\0';
  acc[0x37] = '\0';
  acc[0x38] = '\0';
  acc[0x39] = '\0';
  acc[0x3a] = '\0';
  acc[0x3b] = '\0';
  acc[0x3c] = '\0';
  acc[0x3d] = '\0';
  acc[0x3e] = '\0';
  acc[0x3f] = '\0';
  acc[0x20] = '\0';
  acc[0x21] = '\0';
  acc[0x22] = '\0';
  acc[0x23] = '\0';
  acc[0x24] = '\0';
  acc[0x25] = '\0';
  acc[0x26] = '\0';
  acc[0x27] = '\0';
  acc[0x28] = '\0';
  acc[0x29] = '\0';
  acc[0x2a] = '\0';
  acc[0x2b] = '\0';
  acc[0x2c] = '\0';
  acc[0x2d] = '\0';
  acc[0x2e] = '\0';
  acc[0x2f] = '\0';
  acc[0x10] = '\0';
  acc[0x11] = '\0';
  acc[0x12] = '\0';
  acc[0x13] = '\0';
  acc[0x14] = '\0';
  acc[0x15] = '\0';
  acc[0x16] = '\0';
  acc[0x17] = '\0';
  acc[0x18] = '\0';
  acc[0x19] = '\0';
  acc[0x1a] = '\0';
  acc[0x1b] = '\0';
  acc[0x1c] = '\0';
  acc[0x1d] = '\0';
  acc[0x1e] = '\0';
  acc[0x1f] = '\0';
  acc[0] = '\0';
  acc[1] = '\0';
  acc[2] = '\0';
  acc[3] = '\0';
  acc[4] = '\0';
  acc[5] = '\0';
  acc[6] = '\0';
  acc[7] = '\0';
  acc[8] = '\0';
  acc[9] = '\0';
  acc[10] = '\0';
  acc[0xb] = '\0';
  acc[0xc] = '\0';
  acc[0xd] = '\0';
  acc[0xe] = '\0';
  acc[0xf] = '\0';
  if (verbose != 0) {
    printf("  ENTROPY test: ");
  }
  mbedtls_entropy_init(&ctx);
  iVar2 = entropy_gather_internal(&ctx);
  if (iVar2 == 0) {
    lVar4 = (long)ctx.source_count;
    iVar6 = 1;
    iVar2 = iVar6;
    if (lVar4 < 0x14) {
      ctx.source[lVar4].f_source = entropy_dummy_source;
      ctx.source[lVar4].p_source = (void *)0x0;
      ctx.source[lVar4].threshold = 0x10;
      ctx.source[lVar4].strong = 0;
      ctx.source_count = ctx.source_count + 1;
      iVar2 = mbedtls_entropy_update_manual(&ctx,buf,0x40);
      if (iVar2 == 0) {
        for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
          iVar3 = mbedtls_entropy_func(&ctx,buf,0x40);
          iVar2 = iVar6;
          if (iVar3 != 0) goto LAB_00120c1f;
          for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
            acc[lVar5] = acc[lVar5] | buf[lVar5];
          }
        }
        lVar4 = 0;
        do {
          if (lVar4 == 0x40) {
            iVar2 = 0;
            break;
          }
          puVar1 = acc + lVar4;
          lVar4 = lVar4 + 1;
          iVar2 = iVar6;
        } while (*puVar1 != '\0');
      }
    }
  }
LAB_00120c1f:
  mbedtls_entropy_free(&ctx);
  if (verbose != 0) {
    __s = "failed";
    if (iVar2 == 0) {
      __s = "passed";
    }
    puts(__s);
    putchar(10);
  }
  return (int)(iVar2 != 0);
}

Assistant:

int mbedtls_entropy_self_test( int verbose )
{
    int ret = 1;
#if !defined(MBEDTLS_TEST_NULL_ENTROPY)
    mbedtls_entropy_context ctx;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    unsigned char acc[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    size_t i, j;
#endif /* !MBEDTLS_TEST_NULL_ENTROPY */

    if( verbose != 0 )
        mbedtls_printf( "  ENTROPY test: " );

#if !defined(MBEDTLS_TEST_NULL_ENTROPY)
    mbedtls_entropy_init( &ctx );

    /* First do a gather to make sure we have default sources */
    if( ( ret = mbedtls_entropy_gather( &ctx ) ) != 0 )
        goto cleanup;

    ret = mbedtls_entropy_add_source( &ctx, entropy_dummy_source, NULL, 16,
                                      MBEDTLS_ENTROPY_SOURCE_WEAK );
    if( ret != 0 )
        goto cleanup;

    if( ( ret = mbedtls_entropy_update_manual( &ctx, buf, sizeof buf ) ) != 0 )
        goto cleanup;

    /*
     * To test that mbedtls_entropy_func writes correct number of bytes:
     * - use the whole buffer and rely on ASan to detect overruns
     * - collect entropy 8 times and OR the result in an accumulator:
     *   any byte should then be 0 with probably 2^(-64), so requiring
     *   each of the 32 or 64 bytes to be non-zero has a false failure rate
     *   of at most 2^(-58) which is acceptable.
     */
    for( i = 0; i < 8; i++ )
    {
        if( ( ret = mbedtls_entropy_func( &ctx, buf, sizeof( buf ) ) ) != 0 )
            goto cleanup;

        for( j = 0; j < sizeof( buf ); j++ )
            acc[j] |= buf[j];
    }

    for( j = 0; j < sizeof( buf ); j++ )
    {
        if( acc[j] == 0 )
        {
            ret = 1;
            goto cleanup;
        }
    }

#if defined(MBEDTLS_ENTROPY_HARDWARE_ALT)
    if( ( ret = mbedtls_entropy_source_self_test( 0 ) ) != 0 )
        goto cleanup;
#endif

cleanup:
    mbedtls_entropy_free( &ctx );
#endif /* !MBEDTLS_TEST_NULL_ENTROPY */

    if( verbose != 0 )
    {
        if( ret != 0 )
            mbedtls_printf( "failed\n" );
        else
            mbedtls_printf( "passed\n" );

        mbedtls_printf( "\n" );
    }

    return( ret != 0 );
}